

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetInputSource.cc
# Opt level: O2

void __thiscall
OffsetInputSource::OffsetInputSource
          (OffsetInputSource *this,shared_ptr<InputSource> *proxied,qpdf_offset_t global_offset)

{
  logic_error *this_00;
  
  (this->super_InputSource).last_offset = 0;
  (this->super_InputSource).buf_start = 0;
  (this->super_InputSource).buf_len = 0;
  (this->super_InputSource).buf_idx = 0;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__OffsetInputSource_002ac0c8;
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->proxied).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,
             &proxied->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  this->global_offset = global_offset;
  if (-1 < global_offset) {
    this->max_safe_offset = global_offset ^ 0x7fffffffffffffff;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"OffsetInputSource constructed with negative offset");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

OffsetInputSource::OffsetInputSource(
    std::shared_ptr<InputSource> proxied, qpdf_offset_t global_offset) :
    proxied(proxied),
    global_offset(global_offset)
{
    if (global_offset < 0) {
        throw std::logic_error("OffsetInputSource constructed with negative offset");
    }
    this->max_safe_offset = std::numeric_limits<qpdf_offset_t>::max() - global_offset;
}